

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool __thiscall
fmt::v8::detail::
write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128,char8_t>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *out,
          unsigned___int128 value,uint prefix,basic_format_specs<char8_t> *specs,locale_ref loc)

{
  undefined1 value_00 [16];
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar1;
  locale_ref in_R9;
  digit_grouping<char8_t> *this_00;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 local_70 [8];
  digit_grouping<char8_t> grouping;
  basic_format_specs<char8_t> *specs_local;
  uint prefix_local;
  unsigned___int128 value_local;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *out_local;
  locale_ref loc_local;
  
  this_00 = (digit_grouping<char8_t> *)local_70;
  grouping.sep_._32_8_ = loc.locale_;
  digit_grouping<char8_t>::digit_grouping(this_00,in_R9,true);
  value_00._8_8_ = in_stack_ffffffffffffff50;
  value_00._0_8_ = this_00;
  bVar1 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128,char8_t>
                    (*(detail **)this,(back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out,
                     (unsigned___int128)value_00,prefix,
                     (basic_format_specs<char8_t> *)((ulong)specs & 0xffffffff),
                     (digit_grouping<char8_t> *)grouping.sep_._32_8_);
  *(buffer<char8_t> **)this = bVar1.container;
  digit_grouping<char8_t>::~digit_grouping((digit_grouping<char8_t> *)local_70);
  return true;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  auto grouping = digit_grouping<Char>(loc);
  out = write_int_localized(out, value, prefix, specs, grouping);
  return true;
}